

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containersNative.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
chatra::emb::containers::ContainersPackageInterface::saveNativePtr
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ContainersPackageInterface *this,PackageContext *pct,INativePtr *ptr)

{
  size_type sVar1;
  size_type sVar2;
  const_iterator __position;
  const_iterator __first;
  const_iterator __last;
  ByteArrayData *self;
  NativeData *data;
  INativePtr *ptr_local;
  PackageContext *pct_local;
  ContainersPackageInterface *this_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  writeInt<unsigned_long>(__return_storage_ptr__,(long)*(int *)&ptr[1]._vptr_INativePtr);
  if (*(int *)&ptr[1]._vptr_INativePtr == 0) {
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(ptr + 3));
    writeInt<unsigned_long>(__return_storage_ptr__,sVar1);
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(__return_storage_ptr__)
    ;
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(ptr + 3));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (__return_storage_ptr__,sVar1 + sVar2);
    __position = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                           (__return_storage_ptr__);
    __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(ptr + 3));
    __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(ptr + 3));
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
               __position,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )__first._M_current,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )__last._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> saveNativePtr(PackageContext& pct, INativePtr* ptr) override {
		(void)pct;
		std::vector<uint8_t> buffer;

		auto* data = static_cast<NativeData*>(ptr);
		writeInt(buffer, static_cast<uint64_t>(data->type));

		switch (data->type) {
		case Type::ByteArray: {
			auto* self = static_cast<ByteArrayData*>(ptr);
			writeInt(buffer, self->data.size());
			buffer.reserve(buffer.size() + self->data.size());
			buffer.insert(buffer.cend(), self->data.cbegin(), self->data.cend());
			break;
		}
		}
		return buffer;
	}